

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FullLocation * __thiscall
slang::BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>(BumpAllocator *this)

{
  FullLocation *pFVar1;
  
  pFVar1 = (FullLocation *)allocate(this,0x18,4);
  (pFVar1->text)._M_len = 0;
  (pFVar1->text)._M_str = (char *)0x0;
  pFVar1->location = (SourceLocation)0x0;
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }